

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O3

ostream * tchecker::parsing::operator<<(ostream *os,sync_constraint_t *c)

{
  element_type *peVar1;
  element_type *peVar2;
  ostream *poVar3;
  
  peVar1 = (c->_process).
           super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(peVar1->_name)._M_dataplus._M_p,(peVar1->_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"@",1);
  peVar2 = (c->_event).
           super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(peVar2->_name)._M_dataplus._M_p,(peVar2->_name)._M_string_length);
  poVar3 = tchecker::operator<<(poVar3,c->_strength);
  return poVar3;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::parsing::sync_constraint_t const & c)
{
  return os << c._process->name() << "@" << c._event->name() << c._strength;
}